

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O0

void drawEllipse(float *region,int width,int height,int depth,uchar *bits,uint8_t *color)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int local_b0;
  int local_88;
  int i;
  int y2;
  int x2;
  float t;
  float n1;
  float n0;
  float v1y;
  float v1x;
  float v0y;
  float v0x;
  float e1sq;
  float e0sq;
  float e1;
  float e0;
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  float y;
  float x;
  uint8_t *color_local;
  uchar *bits_local;
  int depth_local;
  int height_local;
  int width_local;
  float *region_local;
  
  fVar1 = *region;
  fVar2 = region[1];
  fVar8 = region[3];
  fVar9 = region[4];
  fVar5 = region[2] + fVar9;
  fVar6 = region[2] - fVar9;
  fVar6 = sqrtf(fVar8 * 4.0 * fVar8 + fVar6 * fVar6);
  fVar7 = (fVar5 + fVar6) / 2.0;
  fVar5 = (fVar5 - fVar6) / 2.0;
  v1x = sqrtf(fVar7);
  n1 = sqrtf(fVar5);
  v1y = 0.0;
  n0 = 0.0;
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    fVar7 = fVar7 - fVar9;
    fVar5 = fVar5 - fVar9;
    fVar9 = sqrtf(fVar7 * fVar7 + fVar8 * fVar8);
    fVar9 = v1x / fVar9;
    v1x = fVar9 * fVar7;
    v1y = fVar9 * fVar8;
    fVar9 = sqrtf(fVar5 * fVar5 + fVar8 * fVar8);
    n0 = (n1 / fVar9) * fVar5;
    n1 = (n1 / fVar9) * fVar8;
  }
  for (y2 = 0; (float)y2 < 6.2831855; y2 = (int)((float)y2 + 0.001)) {
    fVar8 = cosf((float)y2);
    fVar9 = sinf((float)y2);
    fVar8 = fVar8 * v1x + fVar9 * n0;
    iVar3 = (int)(fVar8 + fVar8 + fVar1 + 0.5);
    fVar8 = cosf((float)y2);
    fVar9 = sinf((float)y2);
    fVar8 = fVar8 * v1y + fVar9 * n1;
    iVar4 = (int)(fVar8 + fVar8 + fVar2 + 0.5);
    if ((((-1 < iVar3) && (iVar3 < width)) && (-1 < iVar4)) && (iVar4 < height)) {
      local_88 = 0;
      while( true ) {
        local_b0 = depth;
        if (2 < depth) {
          local_b0 = 3;
        }
        if (local_b0 <= local_88) break;
        bits[(iVar4 * width + iVar3) * depth + local_88] = color[local_88];
        local_88 = local_88 + 1;
      }
    }
  }
  return;
}

Assistant:

void drawEllipse(const float *region, int width, int height, int depth, unsigned char *bits, const uint8_t *color) {
    /* Centroid (mean) */
    const float x = region[0];
    const float y = region[1];

    /* Covariance matrix [a b; b c] */
    const float a = region[2];
    const float b = region[3];
    const float c = region[4];

    /* Eigenvalues of the covariance matrix */
    const float d = a + c;
    const float e = a - c;
    const float f = sqrtf(4.0f * b * b + e * e);
    const float e0 = (d + f) / 2.0f;       /* First eigenvalue */
    const float e1 = (d - f) / 2.0f;       /* Second eigenvalue */

    /* Desired norm of the eigenvectors */
    const float e0sq = sqrtf(e0);
    const float e1sq = sqrtf(e1);

    /* Eigenvectors */
    float v0x = e0sq;
    float v0y = 0.0f;
    float v1x = 0.0f;
    float v1y = e1sq;

    if (b) {
        v0x = e0 - c;
        v0y = b;
        v1x = e1 - c;
        v1y = b;

        /* Normalize the eigenvectors */
        const float n0 = e0sq / sqrtf(v0x * v0x + v0y * v0y);
        v0x *= n0;
        v0y *= n0;

        const float n1 = e1sq / sqrtf(v1x * v1x + v1y * v1y);
        v1x *= n1;
        v1y *= n1;
    }

    for (float t = 0.0f; t < 2.0f * M_PI; t += 0.001f) {
        int x2 = (int) (x + (cosf(t) * v0x + sinf(t) * v1x) * 2.0f + 0.5f);
        int y2 = (int) (y + (cosf(t) * v0y + sinf(t) * v1y) * 2.0f + 0.5f);

        if ((x2 >= 0) && (x2 < width) && (y2 >= 0) && (y2 < height))
            for (int i = 0; i < min(depth, 3); ++i)
                bits[(y2 * width + x2) * depth + i] = color[i];
    }
}